

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O3

void wabt::WriteType(Stream *stream,Type type,char *desc)

{
  Index value;
  Enum value_00;
  Type local_48;
  string local_40;
  
  value_00 = type.enum_;
  local_48 = type;
  if (desc == (char *)0x0) {
    Type::GetName_abi_cxx11_(&local_40,&local_48);
    WriteS32Leb128(stream,value_00,local_40._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if (local_48.enum_ == Reference) {
      value = local_48.type_index_;
      Type::GetName_abi_cxx11_(&local_40,&local_48);
      WriteS32Leb128(stream,value,local_40._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    WriteS32Leb128(stream,value_00,desc);
    if (value_00 == Reference) {
      WriteS32Leb128(stream,type.type_index_,desc);
      return;
    }
  }
  return;
}

Assistant:

void WriteType(Stream* stream, Type type, const char* desc) {
  WriteS32Leb128(stream, type, desc ? desc : type.GetName().c_str());
  if (type.IsReferenceWithIndex()) {
    WriteS32Leb128(stream, type.GetReferenceIndex(),
                   desc ? desc : type.GetName().c_str());
  }
}